

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xatlas.cpp
# Opt level: O1

uint32_t __thiscall
xatlas::internal::
HashMap<unsigned_int,_xatlas::internal::Hash<unsigned_int>,_xatlas::internal::Equal<unsigned_int>_>
::getNext(HashMap<unsigned_int,_xatlas::internal::Hash<unsigned_int>,_xatlas::internal::Equal<unsigned_int>_>
          *this,uint32_t current)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint8_t *puVar4;
  ulong uVar5;
  
  uVar1 = (this->m_next).m_base.size;
  if (current < uVar1) {
    uVar2 = (this->m_keys).m_base.size;
    puVar4 = (this->m_keys).m_base.buffer;
    uVar5 = (ulong)current;
    do {
      uVar3 = *(uint *)((this->m_next).m_base.buffer + uVar5 * 4);
      uVar5 = (ulong)uVar3;
      if (uVar5 == 0xffffffff) {
        return 0xffffffff;
      }
      if ((uVar2 <= uVar3) || (uVar2 <= current)) break;
      if (*(int *)(puVar4 + uVar5 * 4) == *(int *)(puVar4 + (ulong)current * 4)) {
        return uVar3;
      }
    } while (uVar3 < uVar1);
  }
  __assert_fail("index < m_base.size",
                "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/xatlas/xatlas.cpp"
                ,0x4a8,
                "const T &xatlas::internal::Array<unsigned int>::operator[](uint32_t) const [T = unsigned int]"
               );
}

Assistant:

uint32_t getNext(uint32_t current) const
	{
		uint32_t i = m_next[current];
		E equal;
		while (i != UINT32_MAX) {
			if (equal(m_keys[i], m_keys[current]))
				return i;
			i = m_next[i];
		}
		return UINT32_MAX;
	}